

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGenerator.cpp
# Opt level: O1

double __thiscall
PyreNet::RandomGenerator::generate_uniform(RandomGenerator *this,double lower,double upper)

{
  double dVar1;
  double dVar2;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lg;
  
  local_38 = (undefined1  [8])instanceMutex;
  lg._M_device._0_1_ = 0;
  lg._8_8_ = upper;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_38);
  lg._M_device._0_1_ = 1;
  dVar1 = std::
          generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (this->generator);
  dVar2 = (double)lg._8_8_ - lower;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return dVar1 * dVar2 + lower;
}

Assistant:

double RandomGenerator::generate_uniform(double lower, double upper) {
        std::unique_lock<std::mutex> lg(instanceMutex);
        std::uniform_real_distribution<double> dist(lower, upper);
        return dist(*generator);
    }